

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::CordFieldGenerator::
GenerateSerializeWithCachedSizesToArray(CordFieldGenerator *this,Printer *printer)

{
  Options *field;
  undefined8 uVar1;
  Type TVar2;
  Arg *in_R8;
  string_view format_00;
  string_view parameters;
  FieldDescriptor *format_01;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string_view local_d0;
  Arg local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string local_80;
  undefined1 local_60 [16];
  undefined1 local_40 [8];
  Formatter format;
  Printer *printer_local;
  CordFieldGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)printer;
  Formatter::Formatter((Formatter *)local_40,printer,&(this->super_FieldGeneratorBase).variables_);
  TVar2 = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
  if (TVar2 == TYPE_STRING) {
    format_01 = (this->super_FieldGeneratorBase).field_;
    field = (this->super_FieldGeneratorBase).options_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,"this_._internal_$0(), ");
    uVar1 = format.vars_.
            super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"name");
    local_d0 = (string_view)
               google::protobuf::io::Printer::LookupVar(uVar1,local_e0._M_len,local_e0._M_str);
    absl::lts_20240722::substitute_internal::Arg::Arg(&local_c0,local_d0);
    format_00._M_str = (char *)&local_c0;
    format_00._M_len = (size_t)local_90._M_str;
    absl::lts_20240722::Substitute_abi_cxx11_
              (&local_80,(lts_20240722 *)local_90._M_len,format_00,in_R8);
    local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
    parameters._M_str = local_40;
    parameters._M_len = local_60._8_8_;
    GenerateUtf8CheckCodeForCord
              ((cpp *)format_01,(FieldDescriptor *)field,(Options *)0x0,local_60[0],parameters,
               (Formatter *)format_01);
    std::__cxx11::string::~string((string *)&local_80);
  }
  Formatter::operator()<>
            ((Formatter *)local_40,
             "target = stream->Write$declared_type$($number$, this_._internal_$name$(), target);\n")
  ;
  Formatter::~Formatter((Formatter *)local_40);
  return;
}

Assistant:

void CordFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (field_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForCord(
        field_, options_, false,
        absl::Substitute("this_._internal_$0(), ", printer->LookupVar("name")),
        format);
  }
  format(
      "target = stream->Write$declared_type$($number$, "
      "this_._internal_$name$(), "
      "target);\n");
}